

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OstreamBuffer.cpp
# Opt level: O3

ssize_t __thiscall
binlog::detail::OstreamBuffer::write(OstreamBuffer *this,int __fd,void *__buf,size_t __n)

{
  array<char,_1024UL> *paVar1;
  void *in_RAX;
  undefined4 in_register_00000034;
  array<char,_1024UL> *__dest;
  void *__n_00;
  void *__src;
  
  __src = (void *)CONCAT44(in_register_00000034,__fd);
  if (__buf != (void *)0x0) {
    paVar1 = &this->_buf;
    __dest = (array<char,_1024UL> *)this->_p;
    do {
      __n_00 = (void *)0x400;
      if (__buf < (void *)0x400) {
        __n_00 = __buf;
      }
      if (0x400 < (ulong)(((long)__dest - (long)paVar1) + (long)__n_00)) {
        std::ostream::write((char *)this->_out,(long)paVar1);
        this->_p = paVar1->_M_elems;
        __dest = paVar1;
      }
      in_RAX = memcpy(__dest,__src,(size_t)__n_00);
      __dest = (array<char,_1024UL> *)(this->_p + (long)__n_00);
      this->_p = (char *)__dest;
      __src = (void *)((long)__src + (long)__n_00);
      __buf = (void *)((long)__buf - (long)__n_00);
    } while (__buf != (void *)0x0);
  }
  return (ssize_t)in_RAX;
}

Assistant:

void OstreamBuffer::write(const char* buf, std::size_t size)
{
  while (size != 0)
  {
    const std::size_t wsize = (std::min)(size, _buf.size());
    reserve(wsize);
    memcpy(_p, buf, wsize);
    _p += wsize;
    size -= wsize;
    buf += wsize;
  }
}